

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutUInt8<density::sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  int32_t iVar1;
  uint uVar2;
  runtime_type local_28;
  runtime_type<> type;
  ElementType val;
  EasyRandom *i_rand_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *queue_local;
  
  iVar1 = EasyRandom::get_bool(i_rand,0.9);
  if (iVar1 == 0) {
    type.m_feature_table._5_1_ = 8;
    local_28.m_feature_table = (tuple_type *)density::runtime_type<>::make<unsigned_char>();
    uVar2 = EasyRandom::get_int<unsigned_int>(i_rand,0,3);
    switch(uVar2) {
    case 0:
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::dyn_push_copy((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)queue,&local_28,(void *)((long)&type.m_feature_table + 5));
      break;
    case 1:
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::dyn_push_move((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)queue,&local_28,(void *)((long)&type.m_feature_table + 5));
      break;
    case 2:
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::reentrant_dyn_push_copy
                ((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  *)queue,&local_28,(void *)((long)&type.m_feature_table + 5));
      break;
    case 3:
      density::
      sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::reentrant_dyn_push_move
                ((sp_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  *)queue,&local_28,(void *)((long)&type.m_feature_table + 5));
    }
  }
  else {
    iVar1 = EasyRandom::get_bool(i_rand);
    if (iVar1 == 0) {
      type.m_feature_table._6_1_ = 8;
      density::
      sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
      ::reentrant_emplace<unsigned_char,unsigned_char>
                ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                  *)queue,(uchar *)((long)&type.m_feature_table + 6));
    }
    else {
      type.m_feature_table._7_1_ = 8;
      density::
      sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
      ::emplace<unsigned_char,unsigned_char>
                ((sp_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                  *)queue,(uchar *)((long)&type.m_feature_table + 7));
    }
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    if (i_rand.get_bool())
                        queue.template emplace<uint8_t>(static_cast<uint8_t>(8));
                    else
                        queue.template reentrant_emplace<uint8_t>(static_cast<uint8_t>(8));
                }
                else
                {
                    ElementType val  = 8;
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    switch (i_rand.get_int<unsigned>(0, 3))
                    {
                    case 0:
                        queue.dyn_push_copy(type, &val);
                        break;
                    case 1:
                        queue.dyn_push_move(type, &val);
                        break;
                    case 2:
                        queue.reentrant_dyn_push_copy(type, &val);
                        break;
                    case 3:
                        queue.reentrant_dyn_push_move(type, &val);
                        break;
                    }
                }
                return true;
            }